

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O1

void nmq_set_interval(NMQ *q,uint32_t interval)

{
  uint16_t uVar1;
  uint uVar2;
  
  if (q->inited != '\0') {
    return;
  }
  uVar2 = 10;
  if (10 < interval) {
    uVar2 = interval;
  }
  uVar1 = (uint16_t)uVar2;
  if (9999 < uVar2) {
    uVar1 = 10000;
  }
  q->flush_interval = uVar1;
  return;
}

Assistant:

void nmq_set_interval(NMQ *q, uint32_t interval) {
    if (!q->inited) {
        if (interval > INTERVAL_MAX_MS) {
            q->flush_interval = INTERVAL_MAX_MS;
        } else if (interval < INTERVAL_MIN_MS) {
            q->flush_interval = INTERVAL_MIN_MS;
        } else {
            q->flush_interval = interval;
        }
    }
}